

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O3

void __thiscall PluginFverb::setParameterValue(PluginFverb *this,uint32_t index,float value)

{
  float fVar1;
  undefined8 uVar2;
  char *pcVar3;
  float fVar4;
  
  if (index < 0xf) {
    if ((int)index < 0xd) {
      if (index == 0) {
        this->fBypass = value;
        return;
      }
      if (index == 0xc) {
        fVar4 = value / 100.0;
        fVar1 = (this->fDry).target;
        if ((fVar1 == fVar4) && (!NAN(fVar1) && !NAN(fVar4))) {
          return;
        }
        (this->fDry).target = fVar4;
        (this->fDry).step =
             (fVar4 - (this->fDry).mem) / ((this->fDry).tau * (this->fDry).sampleRate);
        return;
      }
    }
    else {
      if (index == 0xd) {
        fVar4 = value / 100.0;
        fVar1 = (this->fWet).target;
        if ((fVar1 == fVar4) && (!NAN(fVar1) && !NAN(fVar4))) {
          return;
        }
        (this->fWet).target = fVar4;
        (this->fWet).step =
             (fVar4 - (this->fWet).mem) / ((this->fWet).tau * (this->fWet).sampleRate);
        return;
      }
      if (index == 0xe) {
        this->fVintage = 0.5 <= value;
        return;
      }
    }
    if (index - 1 < 0xb) {
      Fverb::set_parameter
                ((this->fDsp)._M_t.super___uniq_ptr_impl<Fverb,_std::default_delete<Fverb>_>._M_t.
                 super__Tuple_impl<0UL,_Fverb_*,_std::default_delete<Fverb>_>.
                 super__Head_base<0UL,_Fverb_*,_false>._M_head_impl,index - 1,value);
      return;
    }
    pcVar3 = "index >= pIdDspFirst && index <= pIdDspLast";
    uVar2 = 0xc3;
  }
  else {
    pcVar3 = "index < kNumParameters";
    uVar2 = 0xb2;
  }
  d_stderr2("assertion failure: \"%s\" in file %s, line %i",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/plugins/fverb/PluginFverb.cpp"
            ,uVar2);
  return;
}

Assistant:

void PluginFverb::setParameterValue(uint32_t index, float value)
{
    DISTRHO_SAFE_ASSERT_RETURN(index < kNumParameters, );

    switch (index) {
    case pIdBypass:
        fBypass = value;
        return;
    case pIdDry:
        fDry.setTarget(value / 100);
        return;
    case pIdWet:
        fWet.setTarget(value / 100);
        return;
    case pIdVintage:
        fVintage = value >= 0.5f;
        return;
    }

    DISTRHO_SAFE_ASSERT_RETURN(index >= pIdDspFirst && index <= pIdDspLast, );
    index -= pIdDspFirst;

    fDsp->set_parameter(index, value);
}